

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymSim.c
# Opt level: O3

void Sim_SymmsSimulate(Sym_Man_t *p,uint *pPat,Vec_Ptr_t *vMatrsNonSym)

{
  uint *puVar1;
  uint uVar2;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  Extra_BitMat_t *p_00;
  void *pvVar6;
  void *pvVar7;
  uint *puVar8;
  int iVar9;
  Vec_Ptr_t *pVVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  timespec ts;
  timespec local_60;
  long local_50;
  uint *local_48;
  Vec_Ptr_t *local_40;
  long local_38;
  
  pVVar10 = p->pNtk->vCis;
  if (0 < pVVar10->nSize) {
    ppvVar3 = pVVar10->pArray;
    pVVar4 = p->vSim;
    uVar11 = 0;
    do {
      iVar9 = *(int *)((long)ppvVar3[uVar11] + 0x10);
      if (((long)iVar9 < 0) || (pVVar4->nSize <= iVar9)) goto LAB_004cf67e;
      pvVar5 = pVVar4->pArray[iVar9];
      uVar13 = uVar11 >> 5 & 0x7ffffff;
      if ((pPat[uVar13] >> ((uint)uVar11 & 0x1f) & 1) == 0) {
        if (0 < p->nSimWords) {
          lVar14 = 0;
          do {
            *(undefined4 *)((long)pvVar5 + lVar14 * 4) = 0;
            lVar14 = lVar14 + 1;
          } while (lVar14 < p->nSimWords);
        }
      }
      else if (0 < p->nSimWords) {
        lVar14 = 0;
        do {
          *(undefined4 *)((long)pvVar5 + lVar14 * 4) = 0xffffffff;
          lVar14 = lVar14 + 1;
        } while (lVar14 < p->nSimWords);
      }
      puVar1 = (uint *)((long)pvVar5 + uVar13 * 4);
      *puVar1 = *puVar1 ^ 1 << ((byte)uVar11 & 0x1f);
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)pVVar10->nSize);
  }
  iVar9 = clock_gettime(3,&local_60);
  if (iVar9 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  pVVar10 = p->vNodes;
  local_48 = pPat;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      Sim_UtilSimulateNodeOne((Abc_Obj_t *)pVVar10->pArray[lVar15],p->vSim,p->nSimWords,0);
      lVar15 = lVar15 + 1;
      pVVar10 = p->vNodes;
    } while (lVar15 < pVVar10->nSize);
  }
  iVar9 = clock_gettime(3,&local_60);
  if (iVar9 < 0) {
    lVar15 = -1;
  }
  else {
    lVar15 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  p->timeSim = p->timeSim + lVar15 + lVar14;
  iVar9 = clock_gettime(3,&local_60);
  if (iVar9 < 0) {
    local_50 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    local_50 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  pVVar10 = p->pNtk->vCos;
  if (0 < pVVar10->nSize) {
    lVar14 = 0;
    local_40 = vMatrsNonSym;
    do {
      if (((p->vPairsTotal->nSize <= lVar14) || (p->vPairsSym->nSize <= lVar14)) ||
         (p->vPairsNonSym->nSize <= lVar14)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar12 = p->vPairsNonSym->pArray[lVar14] + p->vPairsSym->pArray[lVar14];
      iVar9 = p->vPairsTotal->pArray[lVar14];
      if (iVar9 < iVar12) {
        __assert_fail("nPairsTotal >= nPairsSym + nPairsNonSym",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simSymSim.c"
                      ,0x4c,"void Sim_SymmsSimulate(Sym_Man_t *, unsigned int *, Vec_Ptr_t *)");
      }
      if (iVar9 != iVar12) {
        if (vMatrsNonSym->nSize <= lVar14) {
LAB_004cf67e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (p->vSupports->nSize <= lVar14) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                        ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
        }
        if (p->vSuppFun->nSize <= lVar14) goto LAB_004cf67e;
        iVar9 = *(int *)(*(long *)(*(long *)(*(long *)(*pVVar10->pArray[lVar14] + 0x20) + 8) +
                                  (long)**(int **)((long)pVVar10->pArray[lVar14] + 0x20) * 8) + 0x10
                        );
        if (((long)iVar9 < 0) || (p->vSim->nSize <= iVar9)) goto LAB_004cf67e;
        p_00 = (Extra_BitMat_t *)vMatrsNonSym->pArray[lVar14];
        pvVar5 = p->vSupports->pArray[lVar14];
        pvVar6 = p->vSuppFun->pArray[lVar14];
        pvVar7 = p->vSim->pArray[iVar9];
        if (0 < p->nSimWords) {
          puVar1 = p->uPatCol;
          puVar8 = p->uPatRow;
          lVar15 = 0;
          do {
            puVar1[lVar15] =
                 local_48[lVar15] & *(uint *)((long)pvVar6 + lVar15 * 4) &
                 *(uint *)((long)pvVar7 + lVar15 * 4);
            puVar8[lVar15] =
                 ~*(uint *)((long)pvVar7 + lVar15 * 4) &
                 local_48[lVar15] & *(uint *)((long)pvVar6 + lVar15 * 4);
            lVar15 = lVar15 + 1;
          } while (lVar15 < p->nSimWords);
        }
        iVar9 = *(int *)((long)pvVar5 + 4);
        local_38 = lVar14;
        if (0 < iVar9) {
          lVar14 = 0;
          do {
            uVar2 = *(uint *)(*(long *)((long)pvVar5 + 8) + lVar14 * 4);
            if ((p->uPatCol[(int)uVar2 >> 5] >> (uVar2 & 0x1f) & 1) != 0) {
              Extra_BitMatrixOr(p_00,uVar2,p->uPatRow);
              iVar9 = *(int *)((long)pvVar5 + 4);
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < iVar9);
          if (0 < iVar9) {
            lVar14 = 0;
            do {
              uVar2 = *(uint *)(*(long *)((long)pvVar5 + 8) + lVar14 * 4);
              if ((p->uPatRow[(int)uVar2 >> 5] >> (uVar2 & 0x1f) & 1) != 0) {
                Extra_BitMatrixOr(p_00,uVar2,p->uPatCol);
                iVar9 = *(int *)((long)pvVar5 + 4);
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < iVar9);
          }
        }
        lVar14 = local_38;
        vMatrsNonSym = local_40;
        if (0 < p->nSimWords) {
          puVar1 = p->uPatCol;
          puVar8 = p->uPatRow;
          lVar15 = 0;
          do {
            puVar1[lVar15] =
                 ~local_48[lVar15] & *(uint *)((long)pvVar6 + lVar15 * 4) &
                 *(uint *)((long)pvVar7 + lVar15 * 4);
            puVar8[lVar15] =
                 ~(*(uint *)((long)pvVar7 + lVar15 * 4) | local_48[lVar15]) &
                 *(uint *)((long)pvVar6 + lVar15 * 4);
            lVar15 = lVar15 + 1;
          } while (lVar15 < p->nSimWords);
          iVar9 = *(int *)((long)pvVar5 + 4);
        }
        if (0 < iVar9) {
          lVar15 = 0;
          do {
            uVar2 = *(uint *)(*(long *)((long)pvVar5 + 8) + lVar15 * 4);
            if ((p->uPatCol[(int)uVar2 >> 5] >> (uVar2 & 0x1f) & 1) != 0) {
              Extra_BitMatrixOr(p_00,uVar2,p->uPatRow);
              iVar9 = *(int *)((long)pvVar5 + 4);
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < iVar9);
          if (0 < iVar9) {
            lVar15 = 0;
            do {
              uVar2 = *(uint *)(*(long *)((long)pvVar5 + 8) + lVar15 * 4);
              if ((p->uPatRow[(int)uVar2 >> 5] >> (uVar2 & 0x1f) & 1) != 0) {
                Extra_BitMatrixOr(p_00,uVar2,p->uPatCol);
                iVar9 = *(int *)((long)pvVar5 + 4);
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < iVar9);
          }
        }
      }
      lVar14 = lVar14 + 1;
      pVVar10 = p->pNtk->vCos;
    } while (lVar14 < pVVar10->nSize);
  }
  iVar9 = clock_gettime(3,&local_60);
  if (iVar9 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  p->timeMatr = p->timeMatr + lVar14 + local_50;
  return;
}

Assistant:

void Sim_SymmsSimulate( Sym_Man_t * p, unsigned * pPat, Vec_Ptr_t * vMatrsNonSym )
{
    Abc_Obj_t * pNode;
    int i, nPairsTotal, nPairsSym, nPairsNonSym;
    abctime clk;

    // create the simulation matrix
    Sim_SymmsCreateSquare( p, pPat );
    // simulate each node in the DFS order
clk = Abc_Clock();
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pNode, i )
    {
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        Sim_UtilSimulateNodeOne( pNode, p->vSim, p->nSimWords, 0 );
    }
p->timeSim += Abc_Clock() - clk;
    // collect info into the CO matrices
clk = Abc_Clock();
    Abc_NtkForEachCo( p->pNtk, pNode, i )
    {
        pNode = Abc_ObjFanin0(pNode);
//        if ( Abc_ObjIsCi(pNode) || Abc_AigNodeIsConst(pNode) )
//            continue;
        nPairsTotal  = Vec_IntEntry(p->vPairsTotal, i);
        nPairsSym    = Vec_IntEntry(p->vPairsSym,   i);
        nPairsNonSym = Vec_IntEntry(p->vPairsNonSym,i);
        assert( nPairsTotal >= nPairsSym + nPairsNonSym ); 
        if ( nPairsTotal == nPairsSym + nPairsNonSym )
            continue;
        Sim_SymmsDeriveInfo( p, pPat, pNode, vMatrsNonSym, i );
    }
p->timeMatr += Abc_Clock() - clk;
}